

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O2

void __thiscall
BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::Timer
          (Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *this,string prefix,
          string end_msg,LogFlags log_category,bool msg_on_completion)

{
  _Storage<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_true>
  _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  undefined7 in_register_00000011;
  bool in_R8B;
  long in_FS_OFFSET;
  string sStack_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->m_start_t).
  super__Optional_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_true,_true>
  ._M_payload.
  super__Optional_payload_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  ._M_engaged = false;
  args = in_RCX;
  std::__cxx11::string::string
            ((string *)&this->m_prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)log_category);
  std::__cxx11::string::string
            ((string *)&this->m_title,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT71(in_register_00000011,msg_on_completion));
  this->m_log_category = (LogFlags)in_RCX;
  this->m_message_on_completion = in_R8B;
  tinyformat::format<std::__cxx11::string>
            (&sStack_58,(tinyformat *)"%s started",(char *)&this->m_title,args);
  Log(this,&sStack_58);
  std::__cxx11::string::~string((string *)&sStack_58);
  _Var1 = (_Storage<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_true>
           )std::chrono::_V2::steady_clock::now();
  if ((this->m_start_t).
      super__Optional_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_true,_true>
      ._M_payload.
      super__Optional_payload_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
      ._M_engaged == false) {
    (this->m_start_t).
    super__Optional_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_true,_true>
    ._M_payload.
    super__Optional_payload_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
    ._M_engaged = true;
  }
  (this->m_start_t).
  super__Optional_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_true,_true>
  ._M_payload.
  super__Optional_payload_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  ._M_payload = _Var1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Timer(
        std::string prefix,
        std::string end_msg,
        BCLog::LogFlags log_category = BCLog::LogFlags::ALL,
        bool msg_on_completion = true)
        : m_prefix(std::move(prefix)),
          m_title(std::move(end_msg)),
          m_log_category(log_category),
          m_message_on_completion(msg_on_completion)
    {
        this->Log(strprintf("%s started", m_title));
        m_start_t = std::chrono::steady_clock::now();
    }